

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# activation.cpp
# Opt level: O0

Sexp * __thiscall Activation::Get(Activation *this,size_t up_index,size_t right_index)

{
  value_type pSVar1;
  ContractFrameProtector CVar2;
  bool bVar3;
  ContractFrame *pCVar4;
  JetRuntimeException *pJVar5;
  reference ppSVar6;
  allocator local_99;
  string local_98 [32];
  value_type local_78;
  Sexp *result;
  string local_68 [32];
  ulong local_48;
  size_t i;
  Activation *cursor;
  ContractFrameProtector local_28;
  ContractFrameProtector __contract_frame;
  size_t right_index_local;
  size_t up_index_local;
  Activation *this_local;
  
  __contract_frame.protected_frame = (ContractFrame *)right_index;
  ContractFrameProtector::ContractFrameProtector(&local_28,"Get");
  ContractFrameProtector::AddContract(&local_28,NoGc);
  local_48 = 0;
  i = (size_t)this;
  while( true ) {
    CVar2.protected_frame = __contract_frame.protected_frame;
    if (up_index <= local_48) {
      if (i == 0) {
        __assert_fail("cursor != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/activation.cpp"
                      ,0x27,"Sexp *Activation::Get(size_t, size_t)");
      }
      pCVar4 = (ContractFrame *)
               std::vector<Sexp_*,_std::allocator<Sexp_*>_>::size
                         ((vector<Sexp_*,_std::allocator<Sexp_*>_> *)(i + 8));
      if (pCVar4 <= CVar2.protected_frame) {
        result._6_1_ = 1;
        pJVar5 = (JetRuntimeException *)__cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_68,
                   "invalid read of uninitialized variable. Run with --warnings for more details.",
                   (allocator *)((long)&result + 7));
        JetRuntimeException::JetRuntimeException(pJVar5,(string *)local_68);
        result._6_1_ = 0;
        __cxa_throw(pJVar5,&JetRuntimeException::typeinfo,JetRuntimeException::~JetRuntimeException)
        ;
      }
      ppSVar6 = std::vector<Sexp_*,_std::allocator<Sexp_*>_>::operator[]
                          ((vector<Sexp_*,_std::allocator<Sexp_*>_> *)(i + 8),
                           (size_type)__contract_frame.protected_frame);
      pSVar1 = *ppSVar6;
      local_78 = pSVar1;
      if (pSVar1 == (value_type)0x0) {
        pJVar5 = (JetRuntimeException *)__cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_98,
                   "invalid read of uninitialized variable. Run with --warnings for more details.",
                   &local_99);
        JetRuntimeException::JetRuntimeException(pJVar5,(string *)local_98);
        __cxa_throw(pJVar5,&JetRuntimeException::typeinfo,JetRuntimeException::~JetRuntimeException)
        ;
      }
      ContractFrameProtector::~ContractFrameProtector(&local_28);
      return pSVar1;
    }
    if (i == 0) {
      __assert_fail("cursor != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/activation.cpp"
                    ,0x22,"Sexp *Activation::Get(size_t, size_t)");
    }
    bVar3 = Sexp::IsActivation(*(Sexp **)i);
    if (!bVar3) break;
    i = *(size_t *)(*(long *)i + 8);
    local_48 = local_48 + 1;
  }
  __assert_fail("cursor->parent->IsActivation()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/activation.cpp"
                ,0x23,"Sexp *Activation::Get(size_t, size_t)");
}

Assistant:

Sexp *Activation::Get(size_t up_index, size_t right_index) {
  CONTRACT { FORBID_GC; }